

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::array<double,_3UL>_> * __thiscall
tinyusdz::XformOp::get_value<std::array<double,3ul>>
          (optional<std::array<double,_3UL>_> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<std::array<double,_3UL>_> local_68;
  undefined1 local_40 [8];
  array<double,_3UL> value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value._M_elems[2]._4_4_ = interp;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<std::array<double,3ul>>
                      (this,(array<double,_3UL> *)local_40,t,value._M_elems[2]._4_4_);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::
      optional<std::array<double,_3UL>,_0>(__return_storage_ptr__,(array<double,_3UL> *)local_40);
    }
    else {
      nonstd::optional_lite::optional<std::array<double,_3UL>_>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<std::array<double,3ul>>(&local_68,&this->_var);
    nonstd::optional_lite::optional<std::array<double,_3UL>_>::optional<std::array<double,_3UL>,_0>
              (__return_storage_ptr__,&local_68);
    nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }